

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzblockdiag.cpp
# Opt level: O3

void __thiscall
TPZBlockDiagonal<float>::Print
          (TPZBlockDiagonal<float> *this,char *msg,ostream *out,MatrixOutputFormat format)

{
  char cVar1;
  long lVar2;
  size_t sVar3;
  ostream *poVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  char local_51;
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  
  if (format == EFormatted) {
    std::__ostream_insert<char,std::char_traits<char>>(out,"TPZBlockDiagonal matrix ",0x18);
    if (msg != (char *)0x0) {
      sVar3 = strlen(msg);
      std::__ostream_insert<char,std::char_traits<char>>(out,msg,sVar3);
    }
    cVar1 = (char)out;
    std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar1);
    std::ostream::put(cVar1);
    std::ostream::flush();
    lVar5 = (this->fBlockSize).fNElements;
    std::__ostream_insert<char,std::char_traits<char>>(out,"Number of blocks ",0x11);
    poVar4 = std::ostream::_M_insert<long>((long)out);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    if (0 < lVar5) {
      lVar7 = 0;
      local_48 = lVar5;
      do {
        lVar5 = (long)(this->fBlockSize).fStore[lVar7];
        std::__ostream_insert<char,std::char_traits<char>>(out,"block number ",0xd);
        local_50 = lVar7;
        poVar4 = std::ostream::_M_insert<long>((long)out);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," size : ",8);
        poVar4 = std::ostream::_M_insert<long>((long)poVar4);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
        std::ostream::put((char)poVar4);
        std::ostream::flush();
        if (0 < lVar5) {
          lVar7 = (this->fBlockPos).fStore[local_50];
          lVar6 = 0;
          local_40 = lVar5;
          lVar2 = lVar7;
          do {
            do {
              local_38 = lVar2;
              poVar4 = std::ostream::_M_insert<double>((double)(this->fStorage).fStore[lVar7]);
              local_51 = ' ';
              std::__ostream_insert<char,std::char_traits<char>>(poVar4,&local_51,1);
              lVar7 = lVar7 + 1;
              lVar5 = lVar5 + -1;
              lVar2 = local_38;
            } while (lVar5 != 0);
            std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar1);
            std::ostream::put(cVar1);
            std::ostream::flush();
            lVar6 = lVar6 + 1;
            lVar7 = local_38 + local_40;
            lVar5 = local_40;
            lVar2 = lVar7;
          } while (lVar6 != local_40);
        }
        lVar7 = local_50 + 1;
      } while (lVar7 != local_48);
    }
    return;
  }
  TPZMatrix<float>::Print(&this->super_TPZMatrix<float>,msg,out,format);
  return;
}

Assistant:

void TPZBlockDiagonal<TVar>::Print(const char *msg, std::ostream &out, const MatrixOutputFormat format) const {
	
	if(format != EFormatted)
	{
		TPZMatrix<TVar>::Print(msg,out,format);
		return;
	}
	out << "TPZBlockDiagonal matrix ";
	if(msg) out << msg;
	out  << std::endl;
	
	int64_t nblock = fBlockSize.NElements();
	out << "Number of blocks " << nblock << std::endl; 
	int64_t b,bsize,pos;
	for(b=0; b<nblock; b++) {
		bsize = fBlockSize[b];
		out << "block number " << b << " size : " << bsize << std::endl;
		int64_t r,c;
		pos = fBlockPos[b];
		for(c=0; c<bsize; c++) {
			for(r=0; r<bsize ; r++) {
				out << fStorage[pos+r+bsize*c] << ' ';
			}
			out << std::endl;
		}
	}
}